

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O2

void binary_op_list(char *op,List *ls,int m68kop,ParsedOpcodeInfo *info,CCVariant *var)

{
  ParsedOpcodeInfo *extraout_RDX;
  ParsedOpcodeInfo *extraout_RDX_00;
  ParsedOpcodeInfo *info_00;
  ParsedOpcodeInfo *extraout_RDX_01;
  ParsedOpcodeInfo *extraout_RDX_02;
  FILE *pFVar1;
  List *ls_00;
  
  pFVar1 = syn68k_c_stream;
  putc(0x28,(FILE *)syn68k_c_stream);
  info_00 = extraout_RDX;
  if (ls == (List *)0x0) {
    pFVar1 = syn68k_c_stream;
    fputs("0 ",(FILE *)syn68k_c_stream);
    info_00 = extraout_RDX_00;
  }
  while (ls_00 = ls, ls_00 != (List *)0x0) {
    generate_code_for_list(ls_00,(int)pFVar1,info_00,(CCVariant *)info);
    info_00 = extraout_RDX_01;
    ls = (List *)0x0;
    if (ls_00->cdr != (ListStruct *)0x0) {
      pFVar1 = (FILE *)0x11229a;
      fprintf((FILE *)syn68k_c_stream,"%s ",op);
      info_00 = extraout_RDX_02;
      ls = ls_00->cdr;
    }
  }
  putc(0x29,(FILE *)syn68k_c_stream);
  return;
}

Assistant:

static void
binary_op_list (const char *op, List *ls, int m68kop,
		const ParsedOpcodeInfo *info, const CCVariant *var)
{
  putc ('(', syn68k_c_stream);

  /* Output something for empty list. */
  if (ls == NULL)
    fputs ("0 ", syn68k_c_stream);
  for (; ls != NULL; ls = ls->cdr)
    {
      generate_code_for_list (ls, m68kop, info, var);
      if (ls->cdr != NULL)
	fprintf (syn68k_c_stream, "%s ", op);
    }
  putc (')', syn68k_c_stream);
}